

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O1

void __thiscall
Assimp::Collada::Animation::CombineSingleChannelAnimationsRecursively
          (Animation *this,Animation *pParent)

{
  pointer __src;
  pointer *pppAVar1;
  _Rb_tree_header *p_Var2;
  Animation *pAVar3;
  pointer __k;
  pointer ppAVar4;
  bool bVar5;
  iterator iVar6;
  pointer ppAVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childrenTargets;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar7 = (pParent->mSubAnims).
            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (ppAVar7 ==
      (pParent->mSubAnims).
      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    do {
      pAVar3 = *ppAVar7;
      CombineSingleChannelAnimationsRecursively(this,pAVar3);
      if (((bVar5) &&
          (__k = (pAVar3->mChannels).
                 super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                 ._M_impl.super__Vector_impl_data._M_start,
          (long)(pAVar3->mChannels).
                super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)__k == 0xc0)) &&
         (iVar6 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_60,&__k->mTarget), (_Rb_tree_header *)iVar6._M_node == p_Var2)) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,
                   &((pAVar3->mChannels).
                     super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                     ._M_impl.super__Vector_impl_data._M_start)->mTarget);
      }
      else {
        bVar5 = false;
      }
      ppAVar7 = ppAVar7 + 1;
    } while (ppAVar7 !=
             (pParent->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((bVar5) &&
     (ppAVar7 = (pParent->mSubAnims).
                super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
     ppAVar7 !=
     (pParent->mSubAnims).
     super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    __src = ppAVar7 + 1;
    do {
      pAVar3 = *ppAVar7;
      std::
      vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
      ::push_back(&pParent->mChannels,
                  (pAVar3->mChannels).
                  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      ppAVar4 = (pParent->mSubAnims).
                super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (__src != ppAVar4) {
        memmove(ppAVar7,__src,(long)ppAVar4 - (long)__src);
      }
      pppAVar1 = &(pParent->mSubAnims).
                  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + -1;
      if (pAVar3 != (Animation *)0x0) {
        ~Animation(pAVar3);
        operator_delete(pAVar3,0x50);
      }
    } while (ppAVar7 !=
             (pParent->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void CombineSingleChannelAnimationsRecursively(Animation *pParent)
	{
		std::set<std::string> childrenTargets;
		bool childrenAnimationsHaveDifferentChannels = true;

		for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
		{
			Animation *anim = *it;
			CombineSingleChannelAnimationsRecursively(anim);

			if (childrenAnimationsHaveDifferentChannels && anim->mChannels.size() == 1 &&
				childrenTargets.find(anim->mChannels[0].mTarget) == childrenTargets.end()) {
				childrenTargets.insert(anim->mChannels[0].mTarget);
			} else {
				childrenAnimationsHaveDifferentChannels = false;
			}

			++it;
		}

		// We only want to combine animations if they have different channels
		if (childrenAnimationsHaveDifferentChannels)
		{
			for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
			{
				Animation *anim = *it;

				pParent->mChannels.push_back(anim->mChannels[0]);

				it = pParent->mSubAnims.erase(it);

				delete anim;
				continue;
			}
		}
	}